

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O0

void dynamic_api_suite::api_remove_iterator(void)

{
  int iVar1;
  iterator __filename;
  undefined4 extraout_var;
  pair<int,_int> *local_b8;
  undefined4 local_ac;
  size_type local_a8 [2];
  iterator local_98 [2];
  undefined8 local_88;
  iterator where;
  size_type local_78 [2];
  iterator local_68;
  int local_60 [2];
  value_type local_58;
  iterator local_50 [2];
  undefined1 local_40 [8];
  map_view<int,_int,_18446744073709551615UL,_std::less<int>_> span;
  pair<int,_int> array [4];
  
  local_b8 = (pair<int,_int> *)&span.member;
  do {
    memset(local_b8,0,8);
    vista::pair<int,_int>::pair(local_b8);
    local_b8 = local_b8 + 1;
  } while (local_b8 != array + 3);
  vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::map_view<4UL,_0>
            ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40,
             (value_type (*) [4])&span.member);
  local_60[1] = 0xb;
  local_60[0] = 1;
  vista::pair<int,_int>::pair<int,_int,_0>(&local_58,local_60 + 1,local_60);
  local_50[0] = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::insert
                          ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40,
                           local_58);
  local_68 = vista::span<vista::pair<int,_int>,_18446744073709551615UL>::begin
                       ((span<vista::pair<int,_int>,_18446744073709551615UL> *)local_40);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("span.insert({ 11, 1 })","span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x68,"void dynamic_api_suite::api_remove_iterator()",local_50,&local_68);
  local_78[0] = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::size
                          ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40);
  where._4_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x69,"void dynamic_api_suite::api_remove_iterator()",local_78,(long)&where + 4);
  __filename = vista::span<vista::pair<int,_int>,_18446744073709551615UL>::begin
                         ((span<vista::pair<int,_int>,_18446744073709551615UL> *)local_40);
  iVar1 = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::remove
                    ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40,
                     (char *)__filename);
  local_88 = CONCAT44(extraout_var,iVar1);
  local_98[0] = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::end
                          ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("where","span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x6c,"void dynamic_api_suite::api_remove_iterator()",&local_88,local_98);
  local_a8[0] = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::size
                          ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40);
  local_ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x6d,"void dynamic_api_suite::api_remove_iterator()",local_a8,&local_ac);
  return;
}

Assistant:

void api_remove_iterator()
{
    pair<int, int> array[4] = {};
    map_view<int, int> span(array);
    BOOST_TEST_EQ(span.insert({ 11, 1 }), span.begin());
    BOOST_TEST_EQ(span.size(), 1);
    // Split into two lines because remove() does not preserve iterator stability
    auto where = span.remove(span.begin());
    BOOST_TEST_EQ(where, span.end());
    BOOST_TEST_EQ(span.size(), 0);
}